

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,char *segment)

{
  DataDrop *pDVar1;
  string_view local_30;
  Builder local_20;
  
  local_20.wasm = module;
  wasm::Name::Name((Name *)&local_30,segment);
  pDVar1 = wasm::Builder::makeDataDrop(&local_20,(Name)local_30);
  return (BinaryenExpressionRef)pDVar1;
}

Assistant:

BinaryenExpressionRef BinaryenDataDrop(BinaryenModuleRef module,
                                       const char* segment) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeDataDrop(Name(segment)));
}